

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O3

void __thiscall double_conversion::Bignum::MultiplyByPowerOfTen(Bignum *this,int exponent)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  
  if ((exponent != 0) && (this->used_bigits_ != 0)) {
    uVar2 = exponent;
    uVar3 = exponent;
    if (0x1a < exponent) {
      do {
        MultiplyByUInt64(this,0x6765c793fa10079d);
        uVar2 = uVar3 - 0x1b;
        bVar1 = 0x35 < uVar3;
        uVar3 = uVar2;
      } while (bVar1);
    }
    uVar3 = uVar2;
    if (0xc < (int)uVar2) {
      do {
        MultiplyByUInt32(this,0x48c27395);
        uVar2 = uVar3 - 0xd;
        bVar1 = 0x19 < uVar3;
        uVar3 = uVar2;
      } while (bVar1);
    }
    if (0 < (int)uVar2) {
      MultiplyByUInt32(this,MultiplyByPowerOfTen::kFive1_to_12[uVar2 - 1]);
    }
    ShiftLeft(this,exponent);
    return;
  }
  return;
}

Assistant:

void Bignum::MultiplyByPowerOfTen(const int exponent) {
  static const uint64_t kFive27 = DOUBLE_CONVERSION_UINT64_2PART_C(0x6765c793, fa10079d);
  static const uint16_t kFive1 = 5;
  static const uint16_t kFive2 = kFive1 * 5;
  static const uint16_t kFive3 = kFive2 * 5;
  static const uint16_t kFive4 = kFive3 * 5;
  static const uint16_t kFive5 = kFive4 * 5;
  static const uint16_t kFive6 = kFive5 * 5;
  static const uint32_t kFive7 = kFive6 * 5;
  static const uint32_t kFive8 = kFive7 * 5;
  static const uint32_t kFive9 = kFive8 * 5;
  static const uint32_t kFive10 = kFive9 * 5;
  static const uint32_t kFive11 = kFive10 * 5;
  static const uint32_t kFive12 = kFive11 * 5;
  static const uint32_t kFive13 = kFive12 * 5;
  static const uint32_t kFive1_to_12[] =
      { kFive1, kFive2, kFive3, kFive4, kFive5, kFive6,
        kFive7, kFive8, kFive9, kFive10, kFive11, kFive12 };

  DOUBLE_CONVERSION_ASSERT(exponent >= 0);

  if (exponent == 0) {
    return;
  }
  if (used_bigits_ == 0) {
    return;
  }
  // We shift by exponent at the end just before returning.
  int remaining_exponent = exponent;
  while (remaining_exponent >= 27) {
    MultiplyByUInt64(kFive27);
    remaining_exponent -= 27;
  }
  while (remaining_exponent >= 13) {
    MultiplyByUInt32(kFive13);
    remaining_exponent -= 13;
  }
  if (remaining_exponent > 0) {
    MultiplyByUInt32(kFive1_to_12[remaining_exponent - 1]);
  }
  ShiftLeft(exponent);
}